

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ialaw.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_7;
  ostringstream error_message_6;
  double data;
  ostringstream error_message_5;
  ALawExpansion a_law_expansion;
  istream *input_stream;
  ostringstream error_message_4;
  ifstream ifs;
  ostringstream error_message_3;
  char *input_file;
  ostringstream error_message_2;
  int num_input_files;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double compression_factor;
  double abs_max_value;
  option *in_stack_ffffffffffffef48;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffef50;
  undefined1 in_stack_ffffffffffffef57;
  ALawExpansion *in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef60;
  undefined2 in_stack_ffffffffffffef64;
  undefined1 in_stack_ffffffffffffef66;
  undefined1 in_stack_ffffffffffffef67;
  char *local_1088;
  char *local_1040;
  bool local_fe2;
  allocator local_fc9;
  string local_fc8 [32];
  ostringstream local_fa8 [224];
  ostringstream *in_stack_fffffffffffff138;
  string *in_stack_fffffffffffff140;
  allocator local_e29;
  string local_e28 [32];
  ostringstream local_e08 [391];
  allocator local_c81;
  string local_c80 [32];
  ostringstream local_c60 [376];
  ALawExpansion local_ae8;
  char *local_ac0;
  undefined4 local_ab8;
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [376];
  char local_918 [527];
  allocator local_709;
  string local_708 [32];
  ostringstream local_6e8 [376];
  char *local_570;
  allocator local_561;
  string local_560 [32];
  ostringstream local_540 [376];
  int local_3c8;
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [36];
  int local_24;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 32768.0;
  local_20 = 87.6;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_24 = ya_getopt_long(CONCAT13(in_stack_ffffffffffffef67,
                                            CONCAT12(in_stack_ffffffffffffef66,
                                                     in_stack_ffffffffffffef64)),
                                   (char **)in_stack_ffffffffffffef58,
                                   (char *)CONCAT17(in_stack_ffffffffffffef57,
                                                    in_stack_ffffffffffffef50),
                                   in_stack_ffffffffffffef48,(int *)0x103716), pcVar1 = ya_optarg,
        local_24 != -1) {
    if (local_24 == 0x61) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffef58,
                         (double *)CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50));
      bVar3 = local_20 < 1.0;
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        poVar5 = std::operator<<((ostream *)local_3a0,
                                 "The argument for the -a option must be a number ");
        std::operator<<(poVar5,"greater than or equal to one");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"ialaw",&local_3c1);
        sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
    }
    else {
      if (local_24 == 0x68) {
        anon_unknown.dwarf_915::PrintUsage
                  ((ostream *)
                   CONCAT17(in_stack_ffffffffffffef67,
                            CONCAT16(in_stack_ffffffffffffef66,
                                     CONCAT24(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60)))
                  );
        return 0;
      }
      if (local_24 != 0x76) {
        anon_unknown.dwarf_915::PrintUsage
                  ((ostream *)
                   CONCAT17(in_stack_ffffffffffffef67,
                            CONCAT16(in_stack_ffffffffffffef66,
                                     CONCAT24(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60)))
                  );
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar3 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffef58,
                         (double *)CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50));
      local_fe2 = !bVar3 || local_18 <= 0.0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_fe2) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        std::operator<<((ostream *)local_1d8,
                        "The argument for the -v option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"ialaw",&local_1f9);
        sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
    }
  }
  local_3c8 = local_8 - ya_optind;
  if (1 < local_3c8) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    std::operator<<((ostream *)local_540,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,"ialaw",&local_561);
    sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_540);
    return local_4;
  }
  if (local_3c8 == 0) {
    local_1040 = (char *)0x0;
  }
  else {
    local_1040 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_570 = local_1040;
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    std::operator<<((ostream *)local_6e8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"ialaw",&local_709);
    sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6e8);
    return local_4;
  }
  std::ifstream::ifstream(local_918);
  pcVar1 = local_570;
  if (local_570 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_918,(_Ios_Openmode)pcVar1);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_a90);
      poVar5 = std::operator<<((ostream *)local_a90,"Cannot open file ");
      std::operator<<(poVar5,local_570);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ab0,"ialaw",&local_ab1);
      sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
      std::__cxx11::string::~string(local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
      local_4 = 1;
      local_ab8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a90);
      goto LAB_00104523;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    local_1088 = (char *)&std::cin;
  }
  else {
    local_1088 = local_918;
  }
  local_ac0 = local_1088;
  sptk::ALawExpansion::ALawExpansion(&local_ae8,local_18,local_20);
  bVar3 = sptk::ALawExpansion::IsValid(&local_ae8);
  if (bVar3) {
    do {
      bVar3 = sptk::ReadStream<double>
                        ((double *)in_stack_ffffffffffffef58,
                         (istream *)CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50));
      if (!bVar3) {
        local_4 = 0;
        local_ab8 = 1;
        goto LAB_00104505;
      }
      bVar3 = sptk::ALawExpansion::Run
                        (in_stack_ffffffffffffef58,
                         (double *)CONCAT17(in_stack_ffffffffffffef57,in_stack_ffffffffffffef50));
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_e08);
        std::operator<<((ostream *)local_e08,"Failed to decompress");
        paVar6 = &local_e29;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e28,"ialaw",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
        std::__cxx11::string::~string(local_e28);
        std::allocator<char>::~allocator((allocator<char> *)&local_e29);
        local_4 = 1;
        local_ab8 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e08);
        goto LAB_00104505;
      }
      in_stack_ffffffffffffef57 =
           sptk::WriteStream<double>((double)in_stack_ffffffffffffef48,(ostream *)0x1043c4);
    } while ((bool)in_stack_ffffffffffffef57);
    std::__cxx11::ostringstream::ostringstream(local_fa8);
    std::operator<<((ostream *)local_fa8,"Failed to write decompressed data");
    paVar6 = &local_fc9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_fc8,"ialaw",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    std::__cxx11::string::~string(local_fc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fa8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_c60);
    std::operator<<((ostream *)local_c60,"Failed to initialize ALawExpansion");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c80,"ialaw",&local_c81);
    sptk::PrintErrorMessage(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
    std::__cxx11::string::~string(local_c80);
    std::allocator<char>::~allocator((allocator<char> *)&local_c81);
    local_4 = 1;
    local_ab8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c60);
  }
LAB_00104505:
  sptk::ALawExpansion::~ALawExpansion(&local_ae8);
LAB_00104523:
  std::ifstream::~ifstream(local_918);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  double abs_max_value(kDefaultAbsMaxValue);
  double compression_factor(kDefaultCompressionFactor);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "v:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'v': {
        if (!sptk::ConvertStringToDouble(optarg, &abs_max_value) ||
            abs_max_value <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a positive number";
          sptk::PrintErrorMessage("ialaw", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &compression_factor) ||
            compression_factor < 1.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be a number "
                        << "greater than or equal to one";
          sptk::PrintErrorMessage("ialaw", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ALawExpansion a_law_expansion(abs_max_value, compression_factor);
  if (!a_law_expansion.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize ALawExpansion";
    sptk::PrintErrorMessage("ialaw", error_message);
    return 1;
  }

  double data;

  while (sptk::ReadStream(&data, &input_stream)) {
    if (!a_law_expansion.Run(&data)) {
      std::ostringstream error_message;
      error_message << "Failed to decompress";
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }

    if (!sptk::WriteStream(data, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write decompressed data";
      sptk::PrintErrorMessage("ialaw", error_message);
      return 1;
    }
  }

  return 0;
}